

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::GlobalLogSinkSet::FlushLogSinks
          (GlobalLogSinkSet *this)

{
  bool bVar1;
  bool *pbVar2;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_build_O0__deps_absl_src_absl_log_internal_log_sink_set_cc:244:29)>
  local_1a;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_build_O0__deps_absl_src_absl_log_internal_log_sink_set_cc:244:29)>
  status_cleanup;
  ReaderMutexLock global_sinks_lock;
  GlobalLogSinkSet *this_local;
  
  bVar1 = ThreadIsLoggingToLogSink();
  if (bVar1) {
    Mutex::AssertReaderHeld(&this->guard_);
    FlushLogSinksLocked(this);
  }
  else {
    ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&stack0xffffffffffffffe8,&this->guard_);
    pbVar2 = ThreadIsLoggingStatus();
    *pbVar2 = true;
    MakeCleanup<,absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet::FlushLogSinks()::_lambda()_1_>
              (&local_1a);
    FlushLogSinksLocked(this);
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/log/internal/log_sink_set.cc:244:29)>
    ::~Cleanup(&local_1a);
    ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

ABSL_LOCKS_EXCLUDED(guard_) {
    if (ThreadIsLoggingToLogSink()) {
      // The thread_local condition demonstrates that we're already holding the
      // lock in order to iterate over `sinks_` for dispatch.  The thread-safety
      // annotations don't know this, so we use `ABSL_NO_THREAD_SAFETY_ANALYSIS`
      guard_.AssertReaderHeld();
      FlushLogSinksLocked();
    } else {
      absl::ReaderMutexLock global_sinks_lock(&guard_);
      // In case if LogSink::Flush overload decides to log
      ThreadIsLoggingStatus() = true;
      // Ensure the "thread is logging" status is reverted upon leaving the
      // scope even in case of exceptions.
      auto status_cleanup =
          absl::MakeCleanup([] { ThreadIsLoggingStatus() = false; });
      FlushLogSinksLocked();
    }
  }